

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTSayIntentions.cpp
# Opt level: O0

bool __thiscall SayIntentionsConnection::ProcessFetchedData(SayIntentionsConnection *this)

{
  bool bVar1;
  undefined1 bAllowNanAltIfGnd;
  logLevelTy lVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  SayIntentionsConnection *this_00;
  long lVar6;
  long lVar7;
  char *pcVar8;
  long *in_RDI;
  FDStaticData *inStat;
  double dLon;
  double dVar9;
  double dVar10;
  FDDynamicData dyn;
  FDStaticData stat;
  lock_guard<std::recursive_mutex> fdLock;
  LTFlightData *fd;
  unique_lock<std::mutex> mapFdLock;
  double dist;
  positionTy pos;
  FDKeyTy fdKey;
  JSON_Object *pAc;
  size_t i;
  string acFilter;
  positionTy viewPos;
  JSON_Array *pArrAc;
  JSONRootPtr pRoot;
  positionTy *in_stack_fffffffffffffaa8;
  FDStaticData *in_stack_fffffffffffffab0;
  logLevelTy in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  JSON_Object *in_stack_fffffffffffffac0;
  FDKeyTy *in_stack_fffffffffffffac8;
  LTFlightData *in_stack_fffffffffffffad0;
  positionTy *in_stack_fffffffffffffae0;
  DataRefs *in_stack_fffffffffffffae8;
  FDKeyTy *in_stack_fffffffffffffaf0;
  string *o;
  FDStaticData *this_01;
  DatRequTy masterDataType;
  undefined5 in_stack_fffffffffffffb90;
  byte bVar11;
  undefined1 in_stack_fffffffffffffb96;
  undefined1 uVar12;
  ulong uVar13;
  string local_410 [56];
  undefined1 local_3d8;
  double local_3d0;
  FDKeyTy *local_3c8;
  _Head_base<1UL,_void_(*)(json_value_t_*),_false> local_3b8;
  undefined1 local_3a1 [25];
  positionTy *in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc84;
  FDDynamicData *in_stack_fffffffffffffc88;
  LTFlightData *in_stack_fffffffffffffc90;
  allocator<char> local_351;
  string local_350 [32];
  undefined1 local_330 [304];
  string local_200 [144];
  mapped_type *local_170;
  double local_158;
  positionTy local_150;
  byte local_101;
  string local_100 [80];
  JSON_Object *local_b0;
  ulong local_a8;
  string local_a0 [104];
  JSON_Array *local_38;
  undefined4 local_30;
  byte local_1;
  
  if (in_RDI[0x19] == 0) {
    local_1 = 1;
  }
  else if (in_RDI[0x3b] == 200) {
    JSONRootPtr::JSONRootPtr
              ((JSONRootPtr *)in_stack_fffffffffffffac0,
               (char *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<json_value_t,_void_(*)(json_value_t_*)> *)0x230fcf);
    if (bVar1) {
      std::unique_ptr<json_value_t,_void_(*)(json_value_t_*)>::get
                ((unique_ptr<json_value_t,_void_(*)(json_value_t_*)> *)in_stack_fffffffffffffab0);
      local_38 = json_array((JSON_Value *)0x23107f);
      if (local_38 == (JSON_Array *)0x0) {
        lVar2 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)lVar2 < 4) {
          std::unique_ptr<json_value_t,_void_(*)(json_value_t_*)>::get
                    ((unique_ptr<json_value_t,_void_(*)(json_value_t_*)> *)in_stack_fffffffffffffab0
                    );
          uVar3 = json_type((JSON_Value *)0x2310e2);
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTSayIntentions.cpp"
                 ,0x76,"ProcessFetchedData",logERR,"Expected a JSON Array, but got type %d",
                 (ulong)uVar3);
        }
        (**(code **)(*in_RDI + 0x40))();
        local_1 = 0;
        local_30 = 1;
      }
      else {
        DataRefs::GetViewPos();
        DataRefs::GetDebugAcFilter_abi_cxx11_(in_stack_fffffffffffffae8);
        local_a8 = 0;
        while (uVar13 = local_a8, sVar5 = json_array_get_count(local_38), uVar13 < sVar5) {
          local_b0 = json_array_get_object
                               ((JSON_Array *)in_stack_fffffffffffffab0,
                                (size_t)in_stack_fffffffffffffaa8);
          if (local_b0 != (JSON_Object *)0x0) {
            jog_s(in_stack_fffffffffffffac0,
                  (char *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
            DataRefs::GetSIDisplayName_abi_cxx11_(&dataRefs);
            bVar1 = std::operator==((char *)in_stack_fffffffffffffab0,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffaa8);
            if (!bVar1) {
              this_00 = (SayIntentionsConnection *)
                        jog_l((JSON_Object *)in_stack_fffffffffffffab0,
                              (char *)in_stack_fffffffffffffaa8);
              LTFlightData::FDKeyTy::FDKeyTy
                        (in_stack_fffffffffffffaf0,
                         (FDKeyType)((ulong)in_stack_fffffffffffffae8 >> 0x20),
                         (unsigned_long)in_stack_fffffffffffffae0);
              uVar3 = std::__cxx11::string::empty();
              local_101 = 0;
              bVar11 = false;
              if ((uVar3 & 1) == 0) {
                std::__cxx11::string::string(local_100,local_a0);
                local_101 = 1;
                in_stack_fffffffffffffb96 =
                     LTFlightData::FDKeyTy::operator!=
                               ((FDKeyTy *)in_stack_fffffffffffffab0,
                                (string *)in_stack_fffffffffffffaa8);
                bVar11 = in_stack_fffffffffffffb96;
              }
              uVar12 = bVar11;
              if ((local_101 & 1) != 0) {
                std::__cxx11::string::~string(local_100);
              }
              if ((bVar11 & 1) == 0) {
                inStat = (FDStaticData *)
                         jog_n_nan((JSON_Object *)
                                   CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                                   (char *)in_stack_fffffffffffffab0);
                dLon = jog_n_nan((JSON_Object *)
                                 CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                                 (char *)in_stack_fffffffffffffab0);
                lVar6 = jog_l((JSON_Object *)in_stack_fffffffffffffab0,
                              (char *)in_stack_fffffffffffffaa8);
                dVar9 = (double)lVar6;
                dVar10 = (double)in_RDI[0x3d];
                lVar7 = jog_l((JSON_Object *)in_stack_fffffffffffffab0,
                              (char *)in_stack_fffffffffffffaa8);
                masterDataType = (DatRequTy)((ulong)lVar6 >> 0x20);
                positionTy::positionTy
                          (&local_150,(double)inStat,dLon,dVar9 * 0.3048,dVar10,(double)lVar7,NAN,
                           NAN,GND_UNKNOWN,UNIT_WORLD,UNIT_DEG,FPH_UNKNOWN);
                dVar10 = positionTy::dist((positionTy *)in_stack_fffffffffffffab0,
                                          in_stack_fffffffffffffaa8);
                local_158 = dVar10;
                iVar4 = DataRefs::GetFdStdDistance_m(&dataRefs);
                if (dVar10 <= (double)iVar4) {
                  lVar6 = jog_l((JSON_Object *)in_stack_fffffffffffffab0,
                                (char *)in_stack_fffffffffffffaa8);
                  if (lVar6 < 1) {
                    local_150.f = (posFlagsTy)((ushort)local_150.f & 0xfcff | 0x200);
                  }
                  std::unique_lock<std::mutex>::unique_lock
                            ((unique_lock<std::mutex> *)in_stack_fffffffffffffab0,
                             (mutex_type *)in_stack_fffffffffffffaa8);
                  local_170 = std::
                              map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                              ::operator[]((map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                                            *)in_stack_fffffffffffffaf0,
                                           (key_type *)in_stack_fffffffffffffae8);
                  std::lock_guard<std::recursive_mutex>::lock_guard
                            ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffab0,
                             (mutex_type *)in_stack_fffffffffffffaa8);
                  std::unique_lock<std::mutex>::unlock
                            ((unique_lock<std::mutex> *)in_stack_fffffffffffffab0);
                  bVar1 = LTFlightData::empty((LTFlightData *)0x231601);
                  if (bVar1) {
                    LTFlightData::SetKey(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
                  }
                  LTFlightData::FDStaticData::FDStaticData(in_stack_fffffffffffffab0);
                  pcVar8 = jog_s(in_stack_fffffffffffffac0,
                                 (char *)CONCAT44(in_stack_fffffffffffffabc,
                                                  in_stack_fffffffffffffab8));
                  std::__cxx11::string::operator=((string *)(local_330 + 0x20),pcVar8);
                  pcVar8 = jog_s(in_stack_fffffffffffffac0,
                                 (char *)CONCAT44(in_stack_fffffffffffffabc,
                                                  in_stack_fffffffffffffab8));
                  std::__cxx11::string::operator=((string *)(local_330 + 0x60),pcVar8);
                  jog_s(in_stack_fffffffffffffac0,
                        (char *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffae8,
                             (allocator<char> *)in_stack_fffffffffffffae0);
                  UnprocessCallSign(this_00,(string *)
                                            CONCAT17(uVar12,CONCAT16(in_stack_fffffffffffffb96,
                                                                     CONCAT15(bVar11,
                                                  in_stack_fffffffffffffb90))));
                  this_01 = (FDStaticData *)local_330;
                  std::__cxx11::string::operator=((string *)(local_330 + 0xf8),(string *)this_01);
                  std::__cxx11::string::~string((string *)this_01);
                  std::__cxx11::string::~string(local_350);
                  std::allocator<char>::~allocator(&local_351);
                  jog_s(in_stack_fffffffffffffac0,
                        (char *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
                  o = (string *)&stack0xfffffffffffffc87;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffae8,
                             (allocator<char> *)in_stack_fffffffffffffae0);
                  in_stack_fffffffffffffaf0 =
                       (FDKeyTy *)
                       jog_s(in_stack_fffffffffffffac0,
                             (char *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
                  in_stack_fffffffffffffae8 = (DataRefs *)local_3a1;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffae8,
                             (allocator<char> *)in_stack_fffffffffffffae0);
                  LTFlightData::FDStaticData::setOrigDest
                            (this_01,o,(string *)in_stack_fffffffffffffaf0);
                  std::__cxx11::string::~string((string *)(local_3a1 + 1));
                  std::allocator<char>::~allocator((allocator<char> *)local_3a1);
                  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc88);
                  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc87);
                  in_stack_fffffffffffffae0 =
                       (positionTy *)
                       jog_s(in_stack_fffffffffffffac0,
                             (char *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
                  std::__cxx11::string::operator=(local_200,(char *)in_stack_fffffffffffffae0);
                  LTFlightData::FDDynamicData::FDDynamicData
                            ((FDDynamicData *)in_stack_fffffffffffffab0);
                  bAllowNanAltIfGnd = positionTy::IsOnGnd(&local_150);
                  local_3d8 = bAllowNanAltIfGnd;
                  in_stack_fffffffffffffad0 = (LTFlightData *)positionTy::heading(&local_150);
                  local_3d0 = *(double *)&in_stack_fffffffffffffad0->acKey;
                  in_stack_fffffffffffffac8 =
                       (FDKeyTy *)
                       jog_n_nan((JSON_Object *)
                                 CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                                 (char *)in_stack_fffffffffffffab0);
                  local_3c8 = in_stack_fffffffffffffac8;
                  in_stack_fffffffffffffac0 = (JSON_Object *)positionTy::ts(&local_150);
                  local_3b8._M_head_impl =
                       (((unique_ptr<json_value_t,_void_(*)(json_value_t_*)> *)
                        &in_stack_fffffffffffffac0->wrapping_value)->_M_t).
                       super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>._M_t.
                       super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
                       super__Tuple_impl<1UL,_void_(*)(json_value_t_*)>.
                       super__Head_base<1UL,_void_(*)(json_value_t_*),_false>._M_head_impl;
                  LTFlightData::UpdateData
                            ((LTFlightData *)
                             CONCAT17(uVar12,CONCAT16(in_stack_fffffffffffffb96,
                                                      CONCAT15(bVar11,in_stack_fffffffffffffb90))),
                             inStat,dLon,masterDataType);
                  bVar1 = positionTy::isNormal(in_stack_fffffffffffffae0,(bool)bAllowNanAltIfGnd);
                  in_stack_fffffffffffffabc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffabc);
                  if (bVar1) {
                    LTFlightData::AddDynData
                              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                               in_stack_fffffffffffffc84,in_stack_fffffffffffffc80,
                               in_stack_fffffffffffffc78);
                  }
                  else {
                    in_stack_fffffffffffffab8 = DataRefs::GetLogLevel(&dataRefs);
                    if ((int)in_stack_fffffffffffffab8 < 1) {
                      in_stack_fffffffffffffab0 =
                           (FDStaticData *)LTFlightData::FDKeyTy::c_str((FDKeyTy *)0x231ac9);
                      positionTy::dbgTxt_abi_cxx11_
                                ((positionTy *)
                                 CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
                      in_stack_fffffffffffffaa8 = (positionTy *)std::__cxx11::string::c_str();
                      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTSayIntentions.cpp"
                             ,0xcc,"ProcessFetchedData",logDEBUG,"A/c %s reached invalid pos: %s",
                             in_stack_fffffffffffffab0);
                      std::__cxx11::string::~string(local_410);
                    }
                  }
                  LTFlightData::FDStaticData::~FDStaticData(in_stack_fffffffffffffab0);
                  std::lock_guard<std::recursive_mutex>::~lock_guard
                            ((lock_guard<std::recursive_mutex> *)0x231b75);
                  std::unique_lock<std::mutex>::~unique_lock
                            ((unique_lock<std::mutex> *)in_stack_fffffffffffffab0);
                  local_30 = 0;
                }
                else {
                  local_30 = 4;
                }
              }
              else {
                local_30 = 4;
              }
              LTFlightData::FDKeyTy::~FDKeyTy((FDKeyTy *)0x231b9a);
            }
          }
          local_a8 = local_a8 + 1;
        }
        local_1 = 1;
        local_30 = 1;
        std::__cxx11::string::~string(local_a0);
      }
    }
    else {
      lVar2 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar2 < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTSayIntentions.cpp"
               ,0x70,"ProcessFetchedData",logERR,"Parsing flight data as JSON failed");
      }
      (**(code **)(*in_RDI + 0x40))();
      local_1 = 0;
      local_30 = 1;
    }
    JSONRootPtr::~JSONRootPtr((JSONRootPtr *)0x231c38);
  }
  else {
    (**(code **)(*in_RDI + 0x40))();
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool SayIntentionsConnection::ProcessFetchedData ()
{
    // data is expected to be in netData string
    // short-cut if there is nothing
    if ( !netDataPos ) return true;
    
    // Only proceed in case HTTP response was OK
    if (httpResponse != HTTP_OK) {
        IncErrCnt();
        return false;
    }
    
    // now try to interpret it as JSON
    JSONRootPtr pRoot (netData);
    if (!pRoot) { LOG_MSG(logERR,ERR_JSON_PARSE); IncErrCnt(); return false; }
    
    // The entire JSON is an array of objects
    const JSON_Array* pArrAc = json_array(pRoot.get());
    if (!pArrAc) {
        LOG_MSG(logERR, "Expected a JSON Array, but got type %d",
                (int)json_type(pRoot.get()));
        IncErrCnt();
        return false;
    }
    
    // We need to calculate distance to current camera later on
    const positionTy viewPos = dataRefs.GetViewPos();
    // any a/c filter defined for debugging purposes?
    const std::string acFilter ( dataRefs.GetDebugAcFilter() );

    // Process all flights
    for (size_t i = 0; i < json_array_get_count(pArrAc); ++i)
    {
        const JSON_Object* pAc = json_array_get_object(pArrAc, i);
        if (!pAc) continue;
        
        // Displayname is matching? My own flight! -> Skip it
        if (jog_s(pAc, SI_DISPLAYNAME) == dataRefs.GetSIDisplayName())
            continue;

        // Key is the SayIntentions flight_id
        LTFlightData::FDKeyTy fdKey (LTFlightData::KEY_SAYINTENTIONS,
                                     (unsigned long)jog_l(pAc, SI_KEY));
        // not matching a/c filter? -> skip it
        if (!acFilter.empty() && (fdKey != acFilter))
            continue;
        
        // Position
        positionTy pos (jog_n_nan(pAc, SI_LAT),
                        jog_n_nan(pAc, SI_LON),
                        jog_l(pAc, SI_ALT) * M_per_FT,
                        tsRequest,
                        jog_l(pAc, SI_HEADING));
        
        // SI returns all world's traffic, we restrict to what's within defined limits
        const double dist = pos.dist(viewPos);
        if (dist > dataRefs.GetFdStdDistance_m() )
            continue;
        
        // On ground?
        if (jog_l(pAc, SI_ALT_AGL) <= 0)
            pos.f.onGrnd = GND_ON;

        // from here on access to fdMap guarded by a mutex
        // until FD object is inserted and updated
        std::unique_lock<std::mutex> mapFdLock (mapFdMutex);

        // get the fd object from the map, key is the flight_id,
        // this fetches an existing or, if not existing, creates a new one
        LTFlightData& fd = mapFd[fdKey];

        // also get the data access lock once and for all
        // so following fetch/update calls only make quick recursive calls
        std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
        // now that we have the detail lock we can release the global one
        mapFdLock.unlock();

        // completely new? fill key fields
        if ( fd.empty() )
            fd.SetKey(fdKey);
        
        // -- fill static data --
        LTFlightData::FDStaticData stat;
        stat.reg            = jog_s(pAc, SI_REG);
        stat.acTypeIcao     = jog_s(pAc, SI_AC_TYPE);
        stat.call           = UnprocessCallSign(jog_s(pAc, SI_CALL));
        stat.setOrigDest(jog_s(pAc, SI_ORIGIN),
                         jog_s(pAc, SI_DEST));
        stat.flight         = jog_s(pAc, SI_DISPLAYNAME);
        
        // -- dynamic data --
        LTFlightData::FDDynamicData dyn;
        dyn.gnd             = pos.IsOnGnd();
        dyn.heading         = pos.heading();
        dyn.spd             = jog_n_nan(pAc, SI_SPD);
        dyn.ts              = pos.ts();
        dyn.pChannel        = this;
        
        // update the a/c's master data
        fd.UpdateData(std::move(stat), dist);
        
        // position is rather important, we check for validity
        if ( pos.isNormal(true) ) {
            fd.AddDynData(dyn, 0, 0, &pos);
        }
        else
            LOG_MSG(logDEBUG,ERR_POS_UNNORMAL,fdKey.c_str(),pos.dbgTxt().c_str());
    }
    
    // all good
    return true;
}